

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::WriteChaptersFile(metadata_map_t *m,Segment *s)

{
  FILE *f;
  bool bVar1;
  int iVar2;
  int iVar3;
  Chapters *this;
  pointer ppVar4;
  Edition *this_00;
  Atom *this_01;
  Display *this_02;
  char *__s1;
  char *language;
  Display *display;
  int display_count;
  Atom *atom;
  int idx;
  int atom_count;
  Edition *edition;
  int edition_count;
  FILE *file;
  MetadataInfo *info;
  Chapters *chapters;
  key_type local_30;
  _Self local_28;
  const_iterator info_iter;
  Segment *s_local;
  metadata_map_t *m_local;
  
  local_30 = 0;
  info_iter._M_node = (_Base_ptr)s;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
       ::find(m,&local_30);
  chapters = (Chapters *)
             std::
             map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
             ::end(m);
  bVar1 = std::operator==(&local_28,(_Self *)&chapters);
  if (bVar1) {
    m_local._7_1_ = true;
  }
  else {
    this = mkvparser::Segment::GetChapters((Segment *)info_iter._M_node);
    if (this == (Chapters *)0x0) {
      m_local._7_1_ = true;
    }
    else {
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>
               ::operator->(&local_28);
      f = (ppVar4->second).file;
      iVar2 = mkvparser::Chapters::GetEditionCount(this);
      if (iVar2 < 1) {
        m_local._7_1_ = true;
      }
      else if (iVar2 < 2) {
        this_00 = mkvparser::Chapters::GetEdition(this,0);
        iVar2 = mkvparser::Chapters::Edition::GetAtomCount(this_00);
        for (atom._0_4_ = 0; (int)atom < iVar2; atom._0_4_ = (int)atom + 1) {
          this_01 = mkvparser::Chapters::Edition::GetAtom(this_00,(int)atom);
          iVar3 = mkvparser::Chapters::Atom::GetDisplayCount(this_01);
          if (0 < iVar3) {
            if (1 < iVar3) {
              printf("more than 1 display in atom detected\n");
              return false;
            }
            this_02 = mkvparser::Chapters::Atom::GetDisplay(this_01,0);
            __s1 = mkvparser::Chapters::Display::GetLanguage(this_02);
            if ((__s1 != (char *)0x0) && (iVar3 = strcmp(__s1,"eng"), iVar3 != 0)) {
              printf("only English-language chapter cues are supported\n");
              return false;
            }
            bVar1 = WriteChaptersCue(f,this,this_01,this_02);
            if (!bVar1) {
              return false;
            }
          }
        }
        m_local._7_1_ = true;
      }
      else {
        printf("more than one chapter edition detected\n");
        m_local._7_1_ = false;
      }
    }
  }
  return m_local._7_1_;
}

Assistant:

bool vttdemux::WriteChaptersFile(const metadata_map_t& m,
                                 const mkvparser::Segment* s) {
  const metadata_map_t::const_iterator info_iter = m.find(kChaptersKey);
  if (info_iter == m.end())  // no chapters, so nothing to do
    return true;

  const mkvparser::Chapters* const chapters = s->GetChapters();
  if (chapters == NULL)  // weird
    return true;

  const MetadataInfo& info = info_iter->second;
  FILE* const file = info.file;

  const int edition_count = chapters->GetEditionCount();

  if (edition_count <= 0)  // weird
    return true;  // nothing to do

  if (edition_count > 1) {
    // TODO(matthewjheaney): figure what to do here
    printf("more than one chapter edition detected\n");
    return false;
  }

  const mkvparser::Chapters::Edition* const edition = chapters->GetEdition(0);

  const int atom_count = edition->GetAtomCount();

  for (int idx = 0; idx < atom_count; ++idx) {
    const mkvparser::Chapters::Atom* const atom = edition->GetAtom(idx);
    const int display_count = atom->GetDisplayCount();

    if (display_count <= 0)
      continue;

    if (display_count > 1) {
      // TODO(matthewjheaney): handle case of multiple languages
      printf("more than 1 display in atom detected\n");
      return false;
    }

    const mkvparser::Chapters::Display* const display = atom->GetDisplay(0);

    if (const char* language = display->GetLanguage()) {
      if (strcmp(language, "eng") != 0) {
        // TODO(matthewjheaney): handle case of multiple languages.

        // We must create a separate webvtt file for each language.
        // This isn't a simple problem (which is why we defer it for
        // now), because there's nothing in the header that tells us
        // what languages we have as cues.  We must parse the displays
        // of each atom to determine that.

        // One solution is to make two passes over the input data.
        // First parse the displays, creating an in-memory cache of
        // all the chapter cues, sorted according to their language.
        // After we have read all of the chapter atoms from the input
        // file, we can then write separate output files for each
        // language.

        printf("only English-language chapter cues are supported\n");
        return false;
      }
    }

    if (!WriteChaptersCue(file, chapters, atom, display))
      return false;
  }

  return true;
}